

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

void __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::insert(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
         *this,LocalSet **x)

{
  set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_> *this_00;
  InsertResult IVar1;
  long lVar2;
  _Alloc_node local_40;
  _Alloc_node __an;
  
  if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
    ::_M_insert_unique<wasm::LocalSet*const&>
              ((_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                *)&this->flexible,x);
    return;
  }
  IVar1 = OrderedFixedStorage<wasm::LocalSet_*,_2UL>::insert(&this->fixed,x);
  if (IVar1 == CouldNotInsert) {
    if ((this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used != 2) {
      __assert_fail("fixed.used == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xa7,
                    "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, std::set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::set<wasm::LocalSet *>]"
                   );
    }
    __an._M_t = (_Rb_tree<wasm::LocalSet_*,_wasm::LocalSet_*,_std::_Identity<wasm::LocalSet_*>,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                 *)x;
    if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("flexible.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xa8,
                    "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, std::set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::set<wasm::LocalSet *>]"
                   );
    }
    this_00 = &this->flexible;
    lVar2 = 8;
    local_40._M_t = &this_00->_M_t;
    do {
      std::
      _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
      ::
      _M_insert_unique_<wasm::LocalSet*&,std::_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>::_Alloc_node>
                ((_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                  *)this_00,(const_iterator)&(this->flexible)._M_t._M_impl.super__Rb_tree_header,
                 (LocalSet **)
                 ((long)(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems
                 + lVar2 + -8),&local_40);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x18);
    std::
    _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
    ::_M_insert_unique<wasm::LocalSet*const&>
              ((_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                *)this_00,(LocalSet **)__an._M_t);
    if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      __assert_fail("!usingFixed()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xac,
                    "void wasm::SmallSetBase<wasm::LocalSet *, 2, wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, std::set<wasm::LocalSet *>>::insert(const T &) [T = wasm::LocalSet *, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::LocalSet *, 2>, FlexibleSet = std::set<wasm::LocalSet *>]"
                   );
    }
    (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used = 0;
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }